

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int replace_attr(attr_list list,atom_t attr_id,attr_value_type val_type,attr_value val)

{
  long lVar1;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  short *in_RDI;
  attr_union value;
  int index;
  undefined8 local_38;
  undefined8 local_30;
  int local_24;
  
  local_24 = 0;
  if (*in_RDI != 0) {
    __assert_fail("list->list_of_lists == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                  ,0x2bd,"int replace_attr(attr_list, atom_t, attr_value_type, attr_value)");
  }
  switch(in_EDX) {
  case 0:
    break;
  case 2:
    local_38 = in_RCX;
  case 1:
  case 5:
    local_38 = CONCAT44(local_38._4_4_,(int)in_RCX);
    break;
  case 3:
  case 6:
    local_38 = in_RCX;
    break;
  case 4:
    local_30 = CONCAT44(in_ESI,in_EDX);
    local_38 = in_RCX;
    break;
  case 7:
  case 8:
    local_38 = in_RCX;
    break;
  case 9:
    local_38 = CONCAT44(local_38._4_4_,(int)in_RCX);
  }
  if (in_EDX == 1) {
    for (; local_24 < (int)(uint)*(byte *)(*(long *)(in_RDI + 8) + 1); local_24 = local_24 + 1) {
      if (*(int *)(*(long *)(in_RDI + 8) + 4 + (long)local_24 * 8) == in_ESI) {
        *(undefined4 *)(*(long *)(in_RDI + 8) + 8 + (long)local_24 * 8) = (undefined4)local_38;
        return 1;
      }
    }
  }
  else {
    for (; local_24 < (int)(uint)*(byte *)(*(long *)(in_RDI + 8) + 2); local_24 = local_24 + 1) {
      if (*(int *)(*(long *)(in_RDI + 4) + (long)local_24 * 0x18) == in_ESI) {
        *(int *)(*(long *)(in_RDI + 4) + (long)local_24 * 0x18 + 4) = in_EDX;
        lVar1 = *(long *)(in_RDI + 4) + (long)local_24 * 0x18;
        *(undefined8 *)(lVar1 + 8) = local_38;
        *(undefined8 *)(lVar1 + 0x10) = local_30;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

extern int
replace_attr(attr_list list, atom_t attr_id, attr_value_type val_type, attr_value val)
{
    int index = 0;
    attr_union value;
    assert(list->list_of_lists == 0);
    switch(val_type) {
    case Attr_Int8:
        if (sizeof(long) == 8) {
            value.u.l = (long) val;
        }
    case Attr_Int4:
    case Attr_Atom:
        if (sizeof(int) == 4) {
            value.u.i = (long)val;
        }
        break;
    case Attr_Float16:
        if (sizeof(double) == 16) {
            value.u.d = *(double*)&val;
            break;
        }
    case Attr_Float8:
        if (sizeof(double) == 8) {
            value.u.d = *(double*)&val;
            break;
        } else if (sizeof(float) == 8) {
            value.u.f = *(float*)&val;
            break;
        }
    case Attr_Float4:
        if (sizeof(double) == 4) {
            value.u.d = *(double*)&val;
            break;
        } else if (sizeof(float) == 4) {
            value.u.f = *(float*)&val;
            break;
        }
    case Attr_Opaque:
        value.u.o = *(attr_opaque_p)&val;
        break;
    case Attr_String:
    case Attr_List:
        value.u.p = (void*)val;
        break;
    case Attr_Undefined:
        break;
    }
    if (val_type == Attr_Int4) {
	while (index < list->l.list.iattrs->int_attr_count) {
	    if (list->l.list.iattrs->iattr[index].attr_id == attr_id) {
		list->l.list.iattrs->iattr[index].value = value.u.i;
		return 1;
	    }
	    index++;
	}
    } else {
	while (index < list->l.list.iattrs->other_attr_count) {
	    if (list->l.list.attributes[index].attr_id == attr_id) {
		list->l.list.attributes[index].val_type = val_type;
		list->l.list.attributes[index].value = value;
		return 1;
	    }
	    index++;
	}
    }
    return 0;  
}